

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O0

int auxresume(lua_State *L,lua_State *co,int narg)

{
  int iVar1;
  int local_2c;
  uint local_28;
  int nres;
  int status;
  int narg_local;
  lua_State *co_local;
  lua_State *L_local;
  
  nres = narg;
  _status = co;
  co_local = L;
  iVar1 = lua_checkstack(co,narg);
  if (iVar1 == 0) {
    lua_pushstring(co_local,"too many arguments to resume");
    L_local._4_4_ = -1;
  }
  else {
    lua_xmove(co_local,_status,nres);
    local_28 = lua_resume(_status,co_local,nres,&local_2c);
    if (local_28 < 2) {
      iVar1 = lua_checkstack(co_local,local_2c + 1);
      if (iVar1 == 0) {
        lua_settop(_status,-1 - local_2c);
        lua_pushstring(co_local,"too many results to resume");
        L_local._4_4_ = -1;
      }
      else {
        lua_xmove(_status,co_local,local_2c);
        L_local._4_4_ = local_2c;
      }
    }
    else {
      lua_xmove(_status,co_local,1);
      L_local._4_4_ = -1;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int auxresume (lua_State *L, lua_State *co, int narg) {
  int status, nres;
  if (l_unlikely(!lua_checkstack(co, narg))) {
    lua_pushliteral(L, "too many arguments to resume");
    return -1;  /* error flag */
  }
  lua_xmove(L, co, narg);
  status = lua_resume(co, L, narg, &nres);
  if (l_likely(status == LUA_OK || status == LUA_YIELD)) {
    if (l_unlikely(!lua_checkstack(L, nres + 1))) {
      lua_pop(co, nres);  /* remove results anyway */
      lua_pushliteral(L, "too many results to resume");
      return -1;  /* error flag */
    }
    lua_xmove(co, L, nres);  /* move yielded values */
    return nres;
  }
  else {
    lua_xmove(co, L, 1);  /* move error message */
    return -1;  /* error flag */
  }
}